

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

bool spvOpcodeReturnsLogicalVariablePointer(Op opcode)

{
  bool local_9;
  Op opcode_local;
  
  if ((((((opcode == OpConstantNull) || (opcode == OpFunctionParameter)) ||
        (opcode == OpFunctionCall)) || ((opcode - OpVariable < 3 || (opcode - OpAccessChain < 3))))
      || ((opcode == OpCopyObject || ((opcode == OpSelect || (opcode == OpPhi)))))) ||
     ((opcode - OpUntypedVariableKHR < 3 ||
      ((opcode == OpUntypedPtrAccessChainKHR || (opcode == OpRawAccessChainNV)))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool spvOpcodeReturnsLogicalVariablePointer(const spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
    case spv::Op::OpFunctionParameter:
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpCopyObject:
    case spv::Op::OpSelect:
    case spv::Op::OpPhi:
    case spv::Op::OpFunctionCall:
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpUntypedPtrAccessChainKHR:
    case spv::Op::OpLoad:
    case spv::Op::OpConstantNull:
    case spv::Op::OpRawAccessChainNV:
      return true;
    default:
      return false;
  }
}